

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indexed_indirect_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1ded20::CpuIndexedIndirectTest_sbc_Test::TestBody
          (CpuIndexedIndirectTest_sbc_Test *this)

{
  (this->super_CpuIndexedIndirectTest).super_CpuTest.registers.a = 0xd0;
  (this->super_CpuIndexedIndirectTest).super_CpuTest.registers.p = '\x01';
  (this->super_CpuIndexedIndirectTest).super_CpuTest.expected.a = 0xe0;
  (this->super_CpuIndexedIndirectTest).super_CpuTest.expected.p = 0x80;
  (this->super_CpuIndexedIndirectTest).super_CpuTest.field_0x114 = 0xf0;
  CpuIndexedIndirectTest::run_instruction(&this->super_CpuIndexedIndirectTest,0xe1);
  return;
}

Assistant:

TEST_F(CpuIndexedIndirectTest, sbc) {
    registers.a = 0xD0;
    registers.p = C_FLAG;
    expected.a = 0xE0;
    expected.p = N_FLAG;
    memory_content = 0xF0;

    run_instruction(SBC_INXIND);
}